

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanDecl(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  
  if (ptr == end) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0x14:
    *nextTokPtr = ptr + 1;
    return 0x21;
  default:
switchD_004d0166_caseD_15:
    *nextTokPtr = ptr;
    return 0;
  case 0x16:
  case 0x18:
    if (ptr + 1 == end) {
      return -1;
    }
    pbVar4 = (byte *)(ptr + 2);
    break;
  case 0x1b:
    iVar2 = normal_scanComment(enc,ptr + 1,end,nextTokPtr);
    return iVar2;
  }
LAB_004d017d:
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)pbVar4[-1]);
  switch(bVar1) {
  case 0x15:
switchD_004d019c_caseD_15:
    *nextTokPtr = (char *)(pbVar4 + -1);
    return 0x10;
  case 0x16:
  case 0x18:
    goto switchD_004d019c_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    break;
  case 0x1e:
    if (pbVar4 == (byte *)end) {
      return -1;
    }
    uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar4);
    if ((0x1e < uVar3) || ((0x40200600U >> (uVar3 & 0x1f) & 1) == 0))
    goto switchD_004d019c_caseD_15;
    break;
  default:
    if (bVar1 - 9 < 2) goto switchD_004d019c_caseD_15;
  }
  ptr = (char *)(pbVar4 + -1);
  goto switchD_004d0166_caseD_15;
switchD_004d019c_caseD_16:
  bVar5 = pbVar4 == (byte *)end;
  pbVar4 = pbVar4 + 1;
  if (bVar5) {
    return -1;
  }
  goto LAB_004d017d;
}

Assistant:

static
int PREFIX(scanDecl)(const ENCODING *enc, const char *ptr, const char *end,
                     const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_MINUS:
    return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COND_SECT_OPEN;
  case BT_NMSTRT:
  case BT_HEX:
    ptr += MINBPC(enc);
    break;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_PERCNT:
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      /* don't allow <!ENTITY% foo "whatever"> */
      switch (BYTE_TYPE(enc, ptr + MINBPC(enc))) {
      case BT_S: case BT_CR: case BT_LF: case BT_PERCNT:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      /* fall through */
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DECL_OPEN;
    case BT_NMSTRT:
    case BT_HEX:
      ptr += MINBPC(enc);
      break;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}